

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-x86_64.h
# Opt level: O0

int target_fixed_hard_reg_p(MIR_reg_t hard_reg)

{
  bool local_d;
  MIR_reg_t hard_reg_local;
  
  if (hard_reg < 0x22) {
    local_d = true;
    if ((((((hard_reg != 5) && (local_d = true, hard_reg != 4)) && (local_d = true, hard_reg != 10))
         && ((local_d = true, hard_reg != 0xb && (local_d = true, hard_reg != 0x18)))) &&
        ((local_d = true, hard_reg != 0x19 &&
         ((local_d = true, hard_reg != 0x18 && (local_d = true, hard_reg != 0x19)))))) &&
       (local_d = true, hard_reg != 0x20)) {
      local_d = hard_reg == 0x21;
    }
    return (int)local_d;
  }
  __assert_fail("hard_reg <= MAX_HARD_REG",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-x86_64.h"
                ,0x31,"int target_fixed_hard_reg_p(MIR_reg_t)");
}

Assistant:

static inline int target_fixed_hard_reg_p (MIR_reg_t hard_reg) {
  assert (hard_reg <= MAX_HARD_REG);
  return (hard_reg == BP_HARD_REG || hard_reg == SP_HARD_REG || hard_reg == TEMP_INT_HARD_REG1
          || hard_reg == TEMP_INT_HARD_REG2 || hard_reg == TEMP_FLOAT_HARD_REG1
          || hard_reg == TEMP_FLOAT_HARD_REG2 || hard_reg == TEMP_DOUBLE_HARD_REG1
          || hard_reg == TEMP_DOUBLE_HARD_REG2 || hard_reg == ST0_HARD_REG
          || hard_reg == ST1_HARD_REG);
}